

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O3

void display_object_kind_recall(object_kind *kind)

{
  object object;
  object known_obj;
  object oStack_288;
  object local_150;
  
  memset(&oStack_288,0,0x138);
  memset(&local_150,0,0x138);
  object_prep(&oStack_288,kind,L'\0',EXTREMIFY);
  if ((kind->aware != false) || (kind->flavor == (flavor *)0x0)) {
    object_copy(&local_150,&oStack_288);
  }
  oStack_288.known = &local_150;
  display_object_recall(&oStack_288);
  object_wipe(&local_150);
  object_wipe(&oStack_288);
  return;
}

Assistant:

void display_object_kind_recall(struct object_kind *kind)
{
	struct object object = OBJECT_NULL, known_obj = OBJECT_NULL;
	object_prep(&object, kind, 0, EXTREMIFY);
	if (kind->aware || !kind->flavor) {
		object_copy(&known_obj, &object);
	}
	object.known = &known_obj;

	display_object_recall(&object);
	object_wipe(&known_obj);
	object_wipe(&object);
}